

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O0

void __thiscall SocketManager::SMMLF::server(SMMLF *this)

{
  SOCK SVar1;
  SocketOnline *pSVar2;
  SocketOnline *in_RDI;
  int i;
  char buffer [101];
  SOCK in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar3;
  char local_98 [112];
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,(string *)in_RDI);
  server_init((SOCK *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  std::__cxx11::string::~string(local_28);
  iVar3 = node_type;
  while (iVar3 = iVar3 + 1, iVar3 < 3) {
    SVar1 = accept_sock(in_stack_ffffffffffffff54);
    *(SOCK *)((long)&in_RDI[1].buffer + 4) = SVar1;
    read(*(int *)((long)&in_RDI[1].buffer + 4),local_98,1);
    printf("Message form client %d: %c\n",(ulong)((int)local_98[0] - 0x30));
    pSVar2 = (SocketOnline *)operator_new(0x28);
    SocketOnline::SocketOnline(in_RDI,(int)((ulong)pSVar2 >> 0x20),(SOCK)pSVar2);
    socket_io[node_type][local_98[0] + -0x30] = pSVar2;
    (&in_RDI[1].id)[local_98[0] + -0x30] = *(int *)((long)&in_RDI[1].buffer + 4);
  }
  return;
}

Assistant:

void SocketManager::SMMLF::server() {
    server_init(serv_sock, ip, port + node_type);
    char buffer[101];
    for (int i = node_type + 1; i < M; i++) {
        sock = accept_sock(serv_sock);
#ifdef UNIX_PLATFORM
        read(sock, buffer, 1);
#else
        recv(sock, buffer, 1, NULL);
#endif
        printf("Message form client %d: %c\n", buffer[0]-'0', buffer[0]);
        socket_io[node_type][buffer[0]-'0'] = new SocketOnline(buffer[0]-'0', sock);
        clnt_sock[buffer[0]-'0'] = sock;
    }
}